

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq1_m(block_iq1_m *x,float *y,int64_t k)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  ushort *puVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar6;
  int j_1;
  int8_t *grid_1;
  int l_1;
  int j;
  int8_t *grid;
  int l;
  float dl2;
  float dl1;
  int ib;
  uint8_t *qh;
  uint8_t *qs;
  float d;
  uint16_t *sc;
  int i;
  iq1m_scale_t scale;
  uint16_t idx [4];
  float delta [4];
  int64_t nb;
  undefined4 local_cc;
  undefined4 local_c4;
  undefined4 local_bc;
  float local_98;
  int local_94;
  int local_88;
  int local_84;
  int local_78;
  int local_6c;
  byte *local_68;
  byte *local_60;
  int local_48;
  ushort local_40 [4];
  float local_38 [6];
  long local_20;
  long local_10;
  long local_8;
  
  local_20 = in_RDX / 0x100;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar4 = local_8 + (long)local_48 * 0x38;
    puVar5 = (ushort *)(lVar4 + 0x30);
    fVar6 = ggml_lookup_fp16_to_fp32
                      ((ushort)((int)(uint)*puVar5 >> 0xc) | *(ushort *)(lVar4 + 0x32) >> 8 & 0xf0 |
                       (ushort)((int)(uint)*(ushort *)(lVar4 + 0x34) >> 4) & 0xf00 |
                       *(ushort *)(lVar4 + 0x36) & 0xf000);
    local_60 = (byte *)(local_8 + (long)local_48 * 0x38);
    local_68 = (byte *)(local_8 + (long)local_48 * 0x38 + 0x20);
    for (local_6c = 0; local_6c < 8; local_6c = local_6c + 1) {
      uVar1 = puVar5[local_6c / 2];
      uVar2 = puVar5[local_6c / 2];
      local_40[0] = (ushort)*local_60 | (*local_68 & 7) << 8;
      local_40[1] = (ushort)local_60[1] | (*local_68 & 0x70) << 4;
      local_40[2] = (ushort)local_60[2] | (local_68[1] & 7) << 8;
      local_40[3] = (ushort)local_60[3] | (local_68[1] & 0x70) << 4;
      local_98 = -0.125;
      if ((*local_68 & 8) == 0) {
        local_98 = 0.125;
      }
      local_38[0] = local_98;
      local_bc = 0xbe000000;
      if ((*local_68 & 0x80) == 0) {
        local_bc = 0x3e000000;
      }
      local_38[1] = (float)local_bc;
      local_c4 = 0xbe000000;
      if ((local_68[1] & 8) == 0) {
        local_c4 = 0x3e000000;
      }
      local_38[2] = (float)local_c4;
      local_cc = 0xbe000000;
      if ((local_68[1] & 0x80) == 0) {
        local_cc = 0x3e000000;
      }
      local_38[3] = (float)local_cc;
      for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
        uVar3 = local_40[local_78];
        for (local_84 = 0; local_84 < 8; local_84 = local_84 + 1) {
          *(float *)(local_10 + (long)local_84 * 4) =
               fVar6 * (float)(((int)(uint)uVar1 >> ((char)(local_6c % 2) * '\x06' & 0x1fU) & 7U) *
                               2 + 1) *
               ((float)(int)*(char *)((long)iq1s_grid + (long)local_84 + (long)(int)(uint)uVar3 * 8)
               + local_38[local_78]);
        }
        local_10 = local_10 + 0x20;
      }
      for (local_88 = 2; local_88 < 4; local_88 = local_88 + 1) {
        uVar1 = local_40[local_88];
        for (local_94 = 0; local_94 < 8; local_94 = local_94 + 1) {
          *(float *)(local_10 + (long)local_94 * 4) =
               fVar6 * (float)(((int)(uint)uVar2 >> ((char)(local_6c % 2) * '\x06' + 3U & 0x1f) & 7U
                               ) * 2 + 1) *
               ((float)(int)*(char *)((long)iq1s_grid + (long)local_94 + (long)(int)(uint)uVar1 * 8)
               + local_38[local_88]);
        }
        local_10 = local_10 + 0x20;
      }
      local_60 = local_60 + 4;
      local_68 = local_68 + 2;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq1_m(const block_iq1_m * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    float delta[4];
    uint16_t idx[4];

    iq1m_scale_t scale;

    for (int i = 0; i < nb; i++) {

        const uint16_t * sc = (const uint16_t *)x[i].scales;
        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);
        const float d = GGML_FP16_TO_FP32(scale.f16);

        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float dl1 = d * (2*((sc[ib/2] >> (6*(ib%2)+0)) & 0x7) + 1);
            const float dl2 = d * (2*((sc[ib/2] >> (6*(ib%2)+3)) & 0x7) + 1);

            idx[0] = qs[0] | ((qh[0] << 8) & 0x700);
            idx[1] = qs[1] | ((qh[0] << 4) & 0x700);
            idx[2] = qs[2] | ((qh[1] << 8) & 0x700);
            idx[3] = qs[3] | ((qh[1] << 4) & 0x700);
            delta[0] = qh[0] & 0x08 ? -IQ1S_DELTA : IQ1S_DELTA;
            delta[1] = qh[0] & 0x80 ? -IQ1S_DELTA : IQ1S_DELTA;
            delta[2] = qh[1] & 0x08 ? -IQ1S_DELTA : IQ1S_DELTA;
            delta[3] = qh[1] & 0x80 ? -IQ1S_DELTA : IQ1S_DELTA;
            for (int l = 0; l < 2; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + idx[l]);
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl1 * (grid[j] + delta[l]);
                }
                y += 8;
            }
            for (int l = 2; l < 4; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + idx[l]);
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl2 * (grid[j] + delta[l]);
                }
                y += 8;
            }
            qs += 4;
            qh += 2;
        }
    }
}